

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O1

dict_remove_result *
wb_tree_remove(dict_remove_result *__return_storage_ptr__,wb_tree *tree,void *key)

{
  wb_node *node;
  
  node = (wb_node *)tree_search_node(tree,key);
  if (node == (wb_node *)0x0) {
    __return_storage_ptr__->key = (void *)0x0;
    __return_storage_ptr__->datum = (void *)0x0;
    *(undefined8 *)&__return_storage_ptr__->removed = 0;
  }
  else {
    __return_storage_ptr__->key = node->key;
    __return_storage_ptr__->datum = node->datum;
    __return_storage_ptr__->removed = true;
    remove_node(tree,node);
  }
  return __return_storage_ptr__;
}

Assistant:

dict_remove_result
wb_tree_remove(wb_tree* tree, const void* key)
{
    wb_node* node = tree_search_node(tree, key);
    if (!node)
	return (dict_remove_result) { NULL, NULL, false };
    dict_remove_result result = { node->key, node->datum, true };
    remove_node(tree, node);
    return result;
}